

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleVar(ImGuiStyleVar idx,ImVec2 *val)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiStyleMod local_24;
  
  pIVar2 = GImGui;
  if (GStyleVarInfo[idx].Count == 2) {
    uVar1 = GStyleVarInfo[idx].Offset;
    local_24.field_1 =
         *(anon_union_8_2_f211c874_for_ImGuiStyleMod_1 *)
          ((long)&(GImGui->Style).Alpha + (ulong)uVar1);
    local_24.VarIdx = idx;
    ImVector<ImGuiStyleMod>::push_back(&GImGui->StyleVarStack,&local_24);
    *(ImVec2 *)((long)&(pIVar2->Style).Alpha + (ulong)uVar1) = *val;
  }
  return;
}

Assistant:

static const ImGuiStyleVarInfo* GetStyleVarInfo(ImGuiStyleVar idx)
{
    IM_ASSERT(idx >= 0 && idx < ImGuiStyleVar_COUNT);
    IM_ASSERT(IM_ARRAYSIZE(GStyleVarInfo) == ImGuiStyleVar_COUNT);
    return &GStyleVarInfo[idx];
}